

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall ON_SubDVertex::ClearFaceMarks(ON_SubDVertex *this)

{
  ON_SubDFace *f;
  unsigned_short vfi;
  bool rc;
  ON_SubDVertex *this_local;
  
  f._7_1_ = true;
  for (f._4_2_ = 0; f._4_2_ < this->m_face_count; f._4_2_ = f._4_2_ + 1) {
    if (this->m_faces[f._4_2_] == (ON_SubDFace *)0x0) {
      f._7_1_ = false;
    }
    else {
      ON_ComponentStatus::ClearRuntimeMark
                (&(this->m_faces[f._4_2_]->super_ON_SubDComponentBase).m_status);
    }
  }
  return f._7_1_;
}

Assistant:

bool ON_SubDVertex::ClearFaceMarks() const
{
  bool rc = true;
  for (unsigned short vfi = 0; vfi < m_face_count; ++vfi)
  {
    const ON_SubDFace* f = m_faces[vfi];
    if (nullptr == f)
      rc = false;
    else
      f->m_status.ClearRuntimeMark();
  }
  return rc;
}